

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

int CGL::Collada::ColladaParser::load(char *filename,SceneInfo *sceneInfo)

{
  byte bVar1;
  bool bVar2;
  XMLElement *pXVar3;
  char *pcVar4;
  double *pdVar5;
  XMLDocument *pXVar6;
  undefined8 in_RSI;
  char *in_RDI;
  XMLElement *e_node;
  XMLElement *e_scene;
  string up_dir;
  XMLElement *up_axis;
  XMLElement *e_asset;
  XMLElement *root;
  XMLDocument doc;
  ifstream in;
  XMLElement *in_stack_00000a60;
  int in_stack_fffffffffffff878;
  int in_stack_fffffffffffff87c;
  XMLDocument *in_stack_fffffffffffff880;
  XMLDocument *in_stack_fffffffffffff888;
  undefined8 in_stack_fffffffffffff8a8;
  XMLDocument *in_stack_fffffffffffff8b0;
  allocator *paVar7;
  XMLDocument *in_stack_fffffffffffff8c0;
  XMLElement *in_stack_fffffffffffff8d0;
  allocator local_681;
  string local_680 [32];
  XMLDocument *local_660;
  allocator local_651;
  string local_650 [32];
  XMLElement *local_630;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_628;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_608;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_5e8 [5];
  allocator local_539;
  string local_538 [16];
  string *in_stack_fffffffffffffad8;
  XMLElement *in_stack_fffffffffffffae0;
  allocator local_511;
  string local_510 [32];
  XMLElement *local_4f0;
  allocator local_4e1;
  string local_4e0 [32];
  XMLElement *local_4c0;
  XMLElement *local_4b8;
  XMLDocument local_4b0;
  undefined4 local_230;
  undefined1 local_220 [520];
  undefined8 local_18;
  int local_4;
  
  local_18 = in_RSI;
  std::ifstream::ifstream(local_220,in_RDI,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_4 = -1;
    local_230 = 1;
  }
  else {
    std::ifstream::close();
    tinyxml2::XMLDocument::XMLDocument
              (in_stack_fffffffffffff8b0,SUB81((ulong)in_stack_fffffffffffff8a8 >> 0x38,0),
               (Whitespace)in_stack_fffffffffffff8a8);
    tinyxml2::XMLDocument::LoadFile(in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
    bVar2 = tinyxml2::XMLDocument::Error(&local_4b0);
    if (bVar2) {
      tinyxml2::XMLDocument::PrintError(in_stack_fffffffffffff8c0);
      exit(1);
    }
    local_4b8 = tinyxml2::XMLNode::FirstChildElement
                          (&in_stack_fffffffffffff880->super_XMLNode,
                           (char *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    if (local_4b8 == (XMLElement *)0x0) {
      exit(1);
    }
    scene = local_18;
    uri_load(in_stack_fffffffffffff8d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e0,"asset",&local_4e1);
    pXVar3 = get_element(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    std::__cxx11::string::~string(local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    local_4c0 = pXVar3;
    if (pXVar3 != (XMLElement *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_510,"up_axis",&local_511);
      pXVar3 = get_element(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      std::__cxx11::string::~string(local_510);
      std::allocator<char>::~allocator((allocator<char> *)&local_511);
      local_4f0 = pXVar3;
      if (pXVar3 == (XMLElement *)0x0) {
        exit(1);
      }
      pcVar4 = tinyxml2::XMLElement::GetText
                         ((XMLElement *)
                          CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_538,pcVar4,&local_539);
      std::allocator<char>::~allocator((allocator<char> *)&local_539);
      Matrix4x4::identity();
      transform._96_8_ = local_5e8[4]._0_8_;
      transform._104_8_ = local_5e8[4]._8_8_;
      transform._112_8_ = local_5e8[4]._16_8_;
      transform._120_8_ = local_5e8[4]._24_8_;
      transform._64_8_ = local_5e8[3]._0_8_;
      transform._72_8_ = local_5e8[3]._8_8_;
      transform._80_8_ = local_5e8[3]._16_8_;
      transform._88_8_ = local_5e8[3]._24_8_;
      transform._32_8_ = local_5e8[2]._0_8_;
      transform._40_8_ = local_5e8[2]._8_8_;
      transform._48_8_ = local_5e8[2]._16_8_;
      transform._56_8_ = local_5e8[2]._24_8_;
      transform._0_8_ = local_5e8[1]._0_8_;
      transform._8_8_ = local_5e8[1]._8_8_;
      transform._16_8_ = local_5e8[1]._16_8_;
      transform._24_8_ = local_5e8[1]._24_8_;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff880,
                              (char *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878))
      ;
      if (bVar2) {
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
                            in_stack_fffffffffffff878);
        *pdVar5 = 0.0;
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
                            in_stack_fffffffffffff878);
        *pdVar5 = 1.0;
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
                            in_stack_fffffffffffff878);
        *pdVar5 = 1.0;
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
                            in_stack_fffffffffffff878);
        *pdVar5 = 0.0;
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
                            in_stack_fffffffffffff878);
        *pdVar5 = -1.0;
        Vector3D::Vector3D((Vector3D *)&local_5e8[0].field_0,1.0,0.0,0.0);
        up = (double)local_5e8[0]._0_8_;
        DAT_0039e588 = (double)local_5e8[0]._8_8_;
        DAT_0039e590 = (double)local_5e8[0]._16_8_;
        DAT_0039e598 = local_5e8[0]._24_8_;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff880,
                                (char *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878
                                                ));
        if (bVar2) {
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
                              in_stack_fffffffffffff878);
          *pdVar5 = 0.0;
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
                              in_stack_fffffffffffff878);
          *pdVar5 = 1.0;
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
                              in_stack_fffffffffffff878);
          *pdVar5 = 1.0;
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
                              in_stack_fffffffffffff878);
          *pdVar5 = 0.0;
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
                              in_stack_fffffffffffff878);
          *pdVar5 = -1.0;
          Vector3D::Vector3D((Vector3D *)&local_608.field_0,0.0,0.0,1.0);
          up = local_608.field_0.x;
          DAT_0039e588 = local_608.field_0.y;
          DAT_0039e590 = local_608.field_0.z;
          DAT_0039e598 = local_608._24_8_;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff880,
                                  (char *)CONCAT44(in_stack_fffffffffffff87c,
                                                   in_stack_fffffffffffff878));
          if (!bVar2) {
            exit(1);
          }
          Vector3D::Vector3D((Vector3D *)&local_628.field_0,0.0,1.0,0.0);
          up = local_628.field_0.x;
          DAT_0039e588 = local_628.field_0.y;
          DAT_0039e590 = local_628.field_0.z;
          DAT_0039e598 = local_628._24_8_;
        }
      }
      std::__cxx11::string::~string(local_538);
    }
    paVar7 = &local_651;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_650,"scene/instance_visual_scene",paVar7);
    pXVar3 = get_element(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    std::__cxx11::string::~string(local_650);
    std::allocator<char>::~allocator((allocator<char> *)&local_651);
    local_630 = pXVar3;
    if (pXVar3 == (XMLElement *)0x0) {
      local_4 = -1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_680,"node",&local_681);
      pXVar6 = (XMLDocument *)get_element(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      std::__cxx11::string::~string(local_680);
      std::allocator<char>::~allocator((allocator<char> *)&local_681);
      local_660 = pXVar6;
      while (local_660 != (XMLDocument *)0x0) {
        parse_node(in_stack_00000a60);
        in_stack_fffffffffffff880 =
             (XMLDocument *)
             tinyxml2::XMLNode::NextSiblingElement
                       (&in_stack_fffffffffffff880->super_XMLNode,
                        (char *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        local_660 = in_stack_fffffffffffff880;
      }
      local_4 = 0;
    }
    local_230 = 1;
    tinyxml2::XMLDocument::~XMLDocument(in_stack_fffffffffffff880);
  }
  std::ifstream::~ifstream(local_220);
  return local_4;
}

Assistant:

int ColladaParser::load( const char* filename, SceneInfo* sceneInfo ) {

  ifstream in (filename);
  if (!in.is_open()) {
    return -1;
  } in.close();

  XMLDocument doc;
  doc.LoadFile(filename);
  if (doc.Error()) {
    stat("XML error: ");
    doc.PrintError();
    exit(EXIT_FAILURE);
  }

  // Check XML schema
  XMLElement* root = doc.FirstChildElement("COLLADA");
  if (!root) {
    stat("Error: not a COLLADA file!")
    exit(EXIT_FAILURE);
  } else {
    stat("Loading COLLADA file...");
  }

  // Set output scene pointer
  scene = sceneInfo;

  // Build uri table
  uri_load(root);

  // Load assets - correct up direction
  if (XMLElement* e_asset = get_element(root, "asset")) {
    XMLElement* up_axis = get_element(e_asset, "up_axis");
    if (!up_axis) {
      stat("Error: No up direction defined in COLLADA file");
      exit(EXIT_FAILURE);
    }

    // get up direction and correct non-Y_UP scenes by setting a non-identity
    // global entry transformation, assuming right hand coordinate system for
    // both input and output

    string up_dir = up_axis->GetText();
    transform = Matrix4x4::identity();
    if (up_dir == "X_UP") {

      // swap X-Y and negate Z
      transform(0,0) =  0; transform(0,1) = 1;
      transform(1,0) =  1; transform(1,1) = 0;
      transform(2,2) = -1;

      // local up direction for lights and cameras
      up = Vector3D(1,0,0);

    } else if (up_dir == "Z_UP") {

      // swap Z-Y matrix and negate X
      transform(1,1) =  0; transform(1,2) = 1;
      transform(2,1) =  1; transform(2,2) = 0;
      transform(0,0) = -1;

      // local up direction cameras
      up = Vector3D(0,0,1);

    } else if (up_dir == "Y_UP") {
      up = Vector3D(0,1,0); // no need to correct Y_UP as its used internally
    } else {
      stat("Error: invalid up direction in COLLADA file");
      exit(EXIT_FAILURE);
    }
  }

  // Load scene -
  // A scene should only have one visual_scene instance, this constraint
  // creates a one-to-one relationship between the document, the top-level
  // scene, and its visual description (COLLADA spec 1.4 page 91)
  if (XMLElement* e_scene = get_element(root, "scene/instance_visual_scene")) {

    stat("Loading scene...");

    // parse all nodes in scene
    XMLElement* e_node = get_element(e_scene, "node");
    while (e_node) {
      parse_node(e_node);
      e_node = e_node->NextSiblingElement("node");
    }

  } else {
    stat("Error: No scene description found in file:" << filename);
    return -1;
  }

  return 0;

}